

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_net.cpp
# Opt level: O2

int KillAll(PClassActor *cls)

{
  uint uVar1;
  DThinker *this;
  PClassActor *pPVar2;
  int iVar3;
  TThinkerIterator<AActor> iterator;
  FThinkerIterator FStack_38;
  
  FThinkerIterator::FThinkerIterator(&FStack_38,&cls->super_PClass,0x80);
  iVar3 = 0;
  while( true ) {
    this = FThinkerIterator::Next(&FStack_38);
    if (this == (DThinker *)0x0) break;
    pPVar2 = (PClassActor *)DObject::GetClass(&this->super_DObject);
    if (((pPVar2 == cls) && (((ulong)this[7].super_DObject.Class & 0x10000000) == 0)) &&
       (((ulong)this[7].super_DObject.Class & 0x200000000000) != 0)) {
      uVar1 = (*(this->super_DObject)._vptr_DObject[0x1f])(this);
      iVar3 = iVar3 + (uVar1 & 0xff);
    }
  }
  return iVar3;
}

Assistant:

static int KillAll(PClassActor *cls)
{
	AActor *actor;
	int killcount = 0;
	TThinkerIterator<AActor> iterator(cls);
	while ( (actor = iterator.Next ()) )
	{
		if (actor->IsA(cls))
		{
			if (!(actor->flags2 & MF2_DORMANT) && (actor->flags3 & MF3_ISMONSTER))
					killcount += actor->Massacre ();
		}
	}
	return killcount;

}